

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::SetConfigurable
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyId propertyId,BOOL value)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined8 in_RAX;
  undefined4 *puVar4;
  uint uVar5;
  int local_34 [2];
  BOOL isNumericPropertyId;
  
  local_34[0] = (int)((ulong)in_RAX >> 0x20);
  if (propertyId == 0xd1) {
    uVar5 = 1;
    if (value != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                  ,0x4a5,"(!value)","!value");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  else {
    BVar3 = UpdateAttribute(this,instance,propertyId,'\x02',value,local_34);
    uVar5 = 1;
    if ((BVar3 == 0) && (uVar5 = 0, local_34[0] == 0)) {
      BVar3 = DictionaryTypeHandlerBase<unsigned_short>::SetConfigurable
                        (&this->super_DictionaryTypeHandlerBase<unsigned_short>,instance,propertyId,
                         value);
      uVar5 = (uint)(BVar3 != 0);
    }
  }
  return uVar5;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::SetConfigurable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        if (propertyId == PropertyIds::length)
        {
            Assert(!value); // Can only set configurable to false
            return true;
        }

        BOOL isNumericPropertyId;
        return UpdateAttribute(instance, propertyId, PropertyConfigurable, value, isNumericPropertyId)
            || (!isNumericPropertyId && __super::SetConfigurable(instance, propertyId, value));
    }